

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdb_functional_test.cc
# Opt level: O3

void long_filename_test(void)

{
  fdb_kvs_handle *pfVar1;
  fdb_status fVar2;
  size_t sVar3;
  char *pcVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  char *__dest;
  char *unaff_R15;
  fdb_file_handle *dbfile;
  fdb_kvs_handle *db;
  void *rvalue;
  size_t rvalue_len;
  char keyword [63];
  timeval __test_begin;
  char key [256];
  char value [256];
  char filename [4096];
  char temp [4096];
  char cmd [4096];
  timeval tStack_33e0;
  char *pcStack_33d0;
  char *pcStack_33c8;
  void **ppvStack_33c0;
  fdb_file_handle *local_33b8;
  fdb_kvs_handle *local_33b0;
  void *local_33a8;
  size_t local_33a0;
  char local_3398 [40];
  undefined7 uStack_3370;
  undefined1 local_3369;
  undefined7 uStack_3368;
  char acStack_3361 [9];
  fdb_kvs_config local_3358;
  timeval local_3340;
  fdb_config local_3330;
  char local_3238 [256];
  char local_3138 [256];
  char local_3038 [4096];
  char local_2038 [4096];
  char local_1038 [4104];
  
  ppvStack_33c0 = (void **)0x111328;
  gettimeofday(&local_3340,(__timezone_ptr_t)0x0);
  ppvStack_33c0 = (void **)0x11132d;
  memleak_start();
  pcVar4 = local_3398;
  uStack_3368 = 0x535251504f4e4d;
  builtin_strncpy(acStack_3361,"TUVWXYZ",8);
  builtin_strncpy(local_3398 + 0x20,"6789ABCD",8);
  uStack_3370 = 0x4b4a4948474645;
  local_3369 = 0x4c;
  builtin_strncpy(local_3398 + 0x10,"qrstuvwxyz012345",0x10);
  builtin_strncpy(local_3398,"abcdefghijklmnop",0x10);
  ppvStack_33c0 = (void **)0x11136a;
  fdb_get_default_config();
  ppvStack_33c0 = (void **)0x111374;
  fdb_get_default_kvs_config();
  ppvStack_33c0 = (void **)0x11138d;
  sprintf(local_2038,"/%s",pcVar4);
  __dest = local_3038;
  ppvStack_33c0 = (void **)0x1113a0;
  strcpy(__dest,pcVar4);
  ppvStack_33c0 = (void **)0x1113a8;
  sVar3 = strlen(__dest);
  if (sVar3 < 0x400) {
    pcVar4 = local_3038;
    __dest = local_3398;
    do {
      ppvStack_33c0 = (void **)0x1113c8;
      strcat(pcVar4,__dest);
      ppvStack_33c0 = (void **)0x1113d0;
      sVar3 = strlen(pcVar4);
    } while (sVar3 < 0x400);
  }
  ppvStack_33c0 = (void **)0x1113f0;
  fVar2 = fdb_open(&local_33b8,local_3038,&local_3330);
  if (fVar2 != FDB_RESULT_TOO_LONG_FILENAME) goto LAB_001116c0;
  __dest = local_3398;
  ppvStack_33c0 = (void **)0x11141a;
  sprintf(local_1038,"rm -rf  %s",__dest);
  ppvStack_33c0 = (void **)0x111422;
  system(local_1038);
  unaff_R15 = "mkdir  %s";
  uVar5 = 0;
  do {
    ppvStack_33c0 = (void **)0x111443;
    sprintf(local_1038,"mkdir  %s",__dest);
    for (uVar7 = uVar5; uVar7 != 0; uVar7 = uVar7 - 1) {
      ppvStack_33c0 = (void **)0x111455;
      strcat(local_1038,local_2038);
    }
    ppvStack_33c0 = (void **)0x111462;
    sVar3 = strlen(local_1038);
    if (0x400 < sVar3) {
      ppvStack_33c0 = (void **)0x1114a4;
      strcpy(local_3038,local_3398);
      if (1 < uVar5) goto LAB_001114a9;
      goto LAB_001114ca;
    }
    ppvStack_33c0 = (void **)0x111472;
    system(local_1038);
    uVar5 = uVar5 + 1;
  } while (uVar5 != 0xf);
  ppvStack_33c0 = (void **)0x11148b;
  strcpy(local_3038,local_3398);
  uVar5 = 0xf;
LAB_001114a9:
  iVar6 = uVar5 - 1;
  __dest = local_2038;
  do {
    ppvStack_33c0 = (void **)0x1114c6;
    strcat(local_3038,__dest);
    iVar6 = iVar6 + -1;
  } while (iVar6 != 0);
LAB_001114ca:
  pcVar4 = local_3038;
  ppvStack_33c0 = (void **)0x1114da;
  sVar3 = strlen(pcVar4);
  builtin_strncpy(local_3038 + sVar3,"/dbfile",8);
  ppvStack_33c0 = (void **)0x1114ff;
  fVar2 = fdb_open(&local_33b8,pcVar4,&local_3330);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_001116c5;
  ppvStack_33c0 = (void **)0x11151a;
  fVar2 = fdb_kvs_open_default(local_33b8,&local_33b0,&local_3358);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_001116ca;
  __dest = local_3238;
  unaff_R15 = "value%08d";
  uVar5 = 0;
  do {
    ppvStack_33c0 = (void **)0x11154e;
    sprintf(__dest,"key%08d",(ulong)uVar5);
    ppvStack_33c0 = (void **)0x11155d;
    sprintf(local_3138,"value%08d",(ulong)uVar5);
    pfVar1 = local_33b0;
    ppvStack_33c0 = (void **)0x11156a;
    sVar3 = strlen(__dest);
    pcVar4 = (char *)(sVar3 + 1);
    ppvStack_33c0 = (void **)0x111576;
    sVar3 = strlen(local_3138);
    ppvStack_33c0 = (void **)0x11158b;
    fVar2 = fdb_set_kv(pfVar1,__dest,(size_t)pcVar4,local_3138,sVar3 + 1);
    if (fVar2 != FDB_RESULT_SUCCESS) {
      ppvStack_33c0 = (void **)0x1116bb;
      long_filename_test();
      goto LAB_001116bb;
    }
    uVar5 = uVar5 + 1;
  } while (uVar5 != 1000);
  ppvStack_33c0 = (void **)0x1115a8;
  fVar2 = fdb_commit(local_33b8,'\0');
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_001116cf;
  pcVar4 = "key%08d";
  __dest = local_3238;
  unaff_R15 = (char *)&local_33a8;
  uVar5 = 0;
  do {
    ppvStack_33c0 = (void **)0x1115da;
    sprintf(__dest,"key%08d",(ulong)uVar5);
    pfVar1 = local_33b0;
    ppvStack_33c0 = (void **)0x1115e7;
    sVar3 = strlen(__dest);
    ppvStack_33c0 = (void **)0x1115fc;
    fVar2 = fdb_get_kv(pfVar1,__dest,sVar3 + 1,(void **)unaff_R15,&local_33a0);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_001116bb;
    ppvStack_33c0 = (void **)0x11160e;
    fdb_free_block(local_33a8);
    uVar5 = uVar5 + 1;
  } while (uVar5 != 1000);
  ppvStack_33c0 = (void **)0x111622;
  fVar2 = fdb_kvs_close(local_33b0);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_001116d4;
  ppvStack_33c0 = (void **)0x111633;
  fVar2 = fdb_close(local_33b8);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    ppvStack_33c0 = (void **)0x111640;
    fVar2 = fdb_shutdown();
    if (fVar2 == FDB_RESULT_SUCCESS) {
      ppvStack_33c0 = (void **)0x111666;
      sprintf(local_1038,"rm -rf  %s",local_3398);
      ppvStack_33c0 = (void **)0x11166e;
      system(local_1038);
      ppvStack_33c0 = (void **)0x111673;
      memleak_end();
      pcVar4 = "%s PASSED\n";
      if (long_filename_test()::__test_pass != '\0') {
        pcVar4 = "%s FAILED\n";
      }
      ppvStack_33c0 = (void **)0x1116a4;
      fprintf(_stderr,pcVar4,"long filename test");
      return;
    }
    goto LAB_001116de;
  }
LAB_001116d9:
  ppvStack_33c0 = (void **)0x1116de;
  long_filename_test();
LAB_001116de:
  ppvStack_33c0 = (void **)error_to_str_test;
  long_filename_test();
  pcStack_33d0 = pcVar4;
  pcStack_33c8 = __dest;
  ppvStack_33c0 = (void **)unaff_R15;
  gettimeofday(&tStack_33e0,(__timezone_ptr_t)0x0);
  memleak_start();
  fVar2 = ~FDB_RESULT_OPEN_FAIL;
  do {
    fVar2 = fVar2 + FDB_RESULT_INVALID_ARGS;
    pcVar4 = fdb_error_msg(fVar2);
    iVar6 = strcmp(pcVar4,"unknown error");
    if (iVar6 == 0) {
      error_to_str_test();
    }
  } while (FDB_RESULT_ALREADY_COMPACTED < fVar2);
  pcVar4 = fdb_error_msg(0xffffffb6);
  iVar6 = strcmp(pcVar4,"unknown error");
  if (iVar6 != 0) {
    error_to_str_test();
  }
  error_to_str_test();
  return;
LAB_001116bb:
  __dest = local_3238;
  ppvStack_33c0 = (void **)0x1116c0;
  long_filename_test();
LAB_001116c0:
  ppvStack_33c0 = (void **)0x1116c5;
  long_filename_test();
LAB_001116c5:
  ppvStack_33c0 = (void **)0x1116ca;
  long_filename_test();
LAB_001116ca:
  ppvStack_33c0 = (void **)0x1116cf;
  long_filename_test();
LAB_001116cf:
  ppvStack_33c0 = (void **)0x1116d4;
  long_filename_test();
LAB_001116d4:
  ppvStack_33c0 = (void **)0x1116d9;
  long_filename_test();
  goto LAB_001116d9;
}

Assistant:

void long_filename_test()
{
    TEST_INIT();
    memleak_start();

    int i, j, r;
    int n=15, m=1000;
    char keyword[] = "abcdefghijklmnopqrstuvwxyz0123456789ABCDEFGHIJKLMNOPQRSTUVWXYZ";
    char filename[4096], cmd[4096], temp[4096];
    fdb_file_handle *dbfile;
    fdb_kvs_handle *db;
    fdb_config config;
    fdb_kvs_config kvs_config;
    fdb_status s;
    size_t rvalue_len;
    char key[256], value[256];
    void *rvalue;

    config = fdb_get_default_config();
    kvs_config = fdb_get_default_kvs_config();
    sprintf(temp, SHELL_DMT"%s", keyword);

    // filename longer than 1024 bytes
    sprintf(filename, "%s", keyword);
    while (strlen(filename) < 1024) {
        strcat(filename, keyword);
    }
    s = fdb_open(&dbfile, filename, &config);
    TEST_CHK(s == FDB_RESULT_TOO_LONG_FILENAME);

    // make nested directories for long path
    // but shorter than 1024 bytes (windows: 256 bytes)
    sprintf(cmd, SHELL_RMDIR" %s", keyword);
    r = system(cmd);
    (void)r;
    for (i=0;i<n;++i) {
        sprintf(cmd, SHELL_MKDIR" %s", keyword);
        for (j=0;j<i;++j){
            strcat(cmd, temp);
        }
        if (strlen(cmd) > SHELL_MAX_PATHLEN) break;
        r = system(cmd);
        (void)r;
    }

    // create DB file
    sprintf(filename, "%s", keyword);
    for (j=0;j<i-1;++j){
        strcat(filename, temp);
    }
    strcat(filename, SHELL_DMT"dbfile");
    s = fdb_open(&dbfile, filename, &config);
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    s = fdb_kvs_open_default(dbfile, &db, &kvs_config);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    // === write ===
    for (i=0;i<m;++i){
        sprintf(key, "key%08d", i);
        sprintf(value, "value%08d", i);
        s = fdb_set_kv(db, key, strlen(key)+1, value, strlen(value)+1);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
    }
    s = fdb_commit(dbfile, FDB_COMMIT_NORMAL);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    // === read ===
    for (i=0;i<m;++i){
        sprintf(key, "key%08d", i);
        s = fdb_get_kv(db, key, strlen(key)+1, &rvalue, &rvalue_len);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        fdb_free_block(rvalue);
    }

    s = fdb_kvs_close(db);
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    s = fdb_close(dbfile);
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    s = fdb_shutdown();
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    sprintf(cmd, SHELL_RMDIR" %s", keyword);
    r = system(cmd);
    (void)r;

    memleak_end();
    TEST_RESULT("long filename test");
}